

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O1

Matrix3x3 * __thiscall
CGL::Matrix3x3::operator*(Matrix3x3 *__return_storage_ptr__,Matrix3x3 *this,Matrix3x3 *B)

{
  double dVar1;
  int i_1;
  long lVar2;
  int k;
  double *pdVar3;
  int i;
  long lVar4;
  Vector3D *pVVar5;
  long lVar6;
  Vector3D *pVVar7;
  undefined8 uVar8;
  
  __return_storage_ptr__->entries[2].x = 0.0;
  __return_storage_ptr__->entries[2].y = 0.0;
  __return_storage_ptr__->entries[1].y = 0.0;
  __return_storage_ptr__->entries[1].z = 0.0;
  __return_storage_ptr__->entries[0].z = 0.0;
  __return_storage_ptr__->entries[1].x = 0.0;
  __return_storage_ptr__->entries[0].x = 0.0;
  __return_storage_ptr__->entries[0].y = 0.0;
  __return_storage_ptr__->entries[2].z = 0.0;
  lVar2 = 0;
  lVar4 = 0;
  pdVar3 = (double *)__return_storage_ptr__;
  do {
    lVar6 = 0;
    do {
      uVar8 = 0x3ff0000000000000;
      if (lVar2 != lVar6) {
        uVar8 = 0;
      }
      *(undefined8 *)((long)pdVar3 + lVar6) = uVar8;
      lVar6 = lVar6 + 0x18;
    } while (lVar6 != 0x48);
    lVar4 = lVar4 + 1;
    pdVar3 = pdVar3 + 1;
    lVar2 = lVar2 + 0x18;
  } while (lVar4 != 3);
  lVar2 = 0;
  do {
    lVar4 = 0;
    pVVar5 = B->entries;
    do {
      pdVar3 = &__return_storage_ptr__->entries[lVar4].x + lVar2;
      *pdVar3 = 0.0;
      dVar1 = 0.0;
      lVar6 = 0;
      pVVar7 = this->entries;
      do {
        dVar1 = dVar1 + ((Vector3D *)&pVVar7->x)->x * (&((Vector3D *)&pVVar5->x)->x)[lVar6];
        lVar6 = lVar6 + 1;
        pVVar7 = pVVar7 + 1;
      } while (lVar6 != 3);
      *pdVar3 = dVar1;
      lVar4 = lVar4 + 1;
      pVVar5 = pVVar5 + 1;
    } while (lVar4 != 3);
    lVar2 = lVar2 + 1;
    this = (Matrix3x3 *)&this->entries[0].y;
  } while (lVar2 != 3);
  return __return_storage_ptr__;
}

Assistant:

Matrix3x3 Matrix3x3::operator*( const Matrix3x3& B ) const {
    const Matrix3x3& A( *this );
    Matrix3x3 C;

    for( int i = 0; i < 3; i++ )
    for( int j = 0; j < 3; j++ )
    {
       C(i,j) = 0.;

       for( int k = 0; k < 3; k++ )
       {
          C(i,j) += A(i,k)*B(k,j);
       }
    }

    return C;
  }